

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.hpp
# Opt level: O0

ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableIntersectingEntry> * __thiscall
rsg::VariableManager::getBegin<rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
          (ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
           *__return_storage_ptr__,VariableManager *this,IsReadableIntersectingEntry filter)

{
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  begin;
  bool bVar1;
  reference ppVVar2;
  const_iterator end;
  byte local_79;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_20;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_18;
  const_iterator first;
  VariableManager *this_local;
  
  first._M_current = (ValueEntry **)this;
  local_18._M_current =
       (ValueEntry **)
       std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::begin
                 (&this->m_entryCache);
  while( true ) {
    local_20._M_current =
         (ValueEntry **)
         std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                   (&this->m_entryCache);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    local_79 = 0;
    if (bVar1) {
      ppVVar2 = __gnu_cxx::
                __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                ::operator*(&local_18);
      bVar1 = rsg::anon_unknown_0::IsReadableIntersectingEntry::operator()(&filter,*ppVVar2);
      local_79 = bVar1 ^ 0xff;
    }
    begin._M_current = local_18._M_current;
    if ((local_79 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
    ::operator++(&local_18,0);
  }
  end = std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                  (&this->m_entryCache);
  ValueEntryIterator<rsg::(anonymous_namespace)::IsReadableIntersectingEntry>::ValueEntryIterator
            (__return_storage_ptr__,(const_iterator)begin._M_current,end,filter);
  return __return_storage_ptr__;
}

Assistant:

ValueEntryIterator<Filter> VariableManager::getBegin (Filter filter) const
{
	std::vector<const ValueEntry*>::const_iterator first = m_entryCache.begin();
	while (first != m_entryCache.end() && !filter(*first))
		first++;
	return ValueEntryIterator<Filter>(first, m_entryCache.end(), filter);
}